

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vwdll.cpp
# Opt level: O2

float VW_Predict(VW_HANDLE handle,VW_EXAMPLE e)

{
  single_learner *this;
  float fVar1;
  
  this = LEARNER::as_singleline<char,char>(*(learner<char,_char> **)((long)handle + 0x28));
  LEARNER::learner<char,_example>::predict(this,(example *)e,0);
  fVar1 = VW::get_prediction((example *)e);
  return fVar1;
}

Assistant:

VW_DLL_MEMBER float VW_CALLING_CONV VW_Predict(VW_HANDLE handle, VW_EXAMPLE e)
{ vw * pointer = static_cast<vw*>(handle);
  example * ex = static_cast<example*>(e);
  LEARNER::as_singleline(pointer->l)->predict(*ex);
  //BUG: The below method may return garbage as it assumes a certain structure for ex->ld
  //which may not be the actual one used (e.g., for cost-sensitive multi-class learning)
  return VW::get_prediction(ex);
}